

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInitializers
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  bool bVar2;
  ImmutableFieldGenerator *pIVar3;
  long lVar4;
  int i;
  long lVar5;
  
  lVar4 = 0;
  for (lVar5 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_, lVar5 < *(int *)(pDVar1 + 4);
      lVar5 = lVar5 + 1) {
    bVar2 = IsRealOneof((FieldDescriptor *)(*(long *)(pDVar1 + 0x28) + lVar4));
    if (!bVar2) {
      pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,
                          (FieldDescriptor *)
                          (*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + lVar4));
      (*pIVar3->_vptr_ImmutableFieldGenerator[7])(pIVar3,printer);
    }
    lVar4 = lVar4 + 0x48;
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInitializers(io::Printer* printer) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!IsRealOneof(descriptor_->field(i))) {
      field_generators_.get(descriptor_->field(i))
          .GenerateInitializationCode(printer);
    }
  }
}